

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

vector<Character_*,_std::allocator<Character_*>_> * __thiscall
Map::CharactersInRange
          (vector<Character_*,_std::allocator<Character_*>_> *__return_storage_ptr__,Map *this,
          uchar x,uchar y,uchar range)

{
  pointer *pppCVar1;
  _List_node_base *p_Var2;
  iterator __position;
  int iVar3;
  int iVar4;
  int iVar5;
  Character *character;
  Character *local_38;
  
  (__return_storage_ptr__->super__Vector_base<Character_*,_std::allocator<Character_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Character_*,_std::allocator<Character_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Character_*,_std::allocator<Character_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var2 = (this->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->characters; p_Var2 = p_Var2->_M_next) {
    local_38 = (Character *)p_Var2[1]._M_next;
    iVar4 = (uint)local_38->x - (uint)x;
    iVar3 = -iVar4;
    if (0 < iVar4) {
      iVar3 = iVar4;
    }
    iVar5 = (uint)local_38->y - (uint)y;
    iVar4 = -iVar5;
    if (0 < iVar5) {
      iVar4 = iVar5;
    }
    if ((uint)(iVar4 + iVar3) <= (uint)range) {
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<Character_*,_std::allocator<Character_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<Character_*,_std::allocator<Character_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Character*,std::allocator<Character*>>::_M_realloc_insert<Character*const&>
                  ((vector<Character*,std::allocator<Character*>> *)__return_storage_ptr__,
                   __position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        pppCVar1 = &(__return_storage_ptr__->
                    super__Vector_base<Character_*,_std::allocator<Character_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Character *> Map::CharactersInRange(unsigned char x, unsigned char y, unsigned char range)
{
	std::vector<Character *> characters;

	UTIL_FOREACH(this->characters, character)
	{
		if (util::path_length(character->x, character->y, x, y) <= range)
			characters.push_back(character);
	}

	return characters;
}